

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.h
# Opt level: O1

char * __thiscall
google::protobuf::internal::EpsCopyInputStream::ReadPackedFixed<int>
          (EpsCopyInputStream *this,char *ptr,int size,RepeatedField<int> *out)

{
  bool bVar1;
  int *piVar2;
  char *pcVar3;
  uint uVar4;
  uint uVar5;
  
  if (ptr == (char *)0x0) {
    return (char *)0x0;
  }
  uVar5 = (*(int *)&this->buffer_end_ - (int)ptr) + 0x10;
  do {
    if (size <= (int)uVar5) {
      RepeatedField<int>::Reserve(out,out->current_size_ + (size >> 2));
      uVar5 = size & 0xfffffffc;
      piVar2 = RepeatedField<int>::AddNAlreadyReserved(out,size >> 2);
      memcpy(piVar2,ptr,(long)(int)uVar5);
      if (size != uVar5) {
        return (char *)0x0;
      }
      return ptr + (int)uVar5;
    }
    RepeatedField<int>::Reserve(out,out->current_size_ + ((int)uVar5 >> 2));
    uVar4 = uVar5 & 0xfffffffc;
    piVar2 = RepeatedField<int>::AddNAlreadyReserved(out,(int)uVar5 >> 2);
    memcpy(piVar2,ptr,(long)(int)uVar4);
    if (this->limit_ < 0x11) {
      bVar1 = false;
    }
    else {
      pcVar3 = Next(this);
      if (pcVar3 == (char *)0x0) {
        bVar1 = false;
        ptr = (char *)0x0;
      }
      else {
        ptr = pcVar3 + (0x10 - (uVar5 & 3));
        uVar5 = (*(int *)&this->buffer_end_ - (int)ptr) + 0x10;
        bVar1 = true;
      }
    }
    size = size - uVar4;
  } while (bVar1);
  return (char *)0x0;
}

Assistant:

const char* EpsCopyInputStream::ReadPackedFixed(const char* ptr, int size,
                                                RepeatedField<T>* out) {
  GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
  int nbytes = buffer_end_ + kSlopBytes - ptr;
  while (size > nbytes) {
    int num = nbytes / sizeof(T);
    int old_entries = out->size();
    out->Reserve(old_entries + num);
    int block_size = num * sizeof(T);
    auto dst = out->AddNAlreadyReserved(num);
#ifdef PROTOBUF_LITTLE_ENDIAN
    std::memcpy(dst, ptr, block_size);
#else
    for (int i = 0; i < num; i++)
      dst[i] = UnalignedLoad<T>(ptr + i * sizeof(T));
#endif
    size -= block_size;
    if (limit_ <= kSlopBytes) return nullptr;
    ptr = Next();
    if (ptr == nullptr) return nullptr;
    ptr += kSlopBytes - (nbytes - block_size);
    nbytes = buffer_end_ + kSlopBytes - ptr;
  }
  int num = size / sizeof(T);
  int old_entries = out->size();
  out->Reserve(old_entries + num);
  int block_size = num * sizeof(T);
  auto dst = out->AddNAlreadyReserved(num);
#ifdef PROTOBUF_LITTLE_ENDIAN
  std::memcpy(dst, ptr, block_size);
#else
  for (int i = 0; i < num; i++) dst[i] = UnalignedLoad<T>(ptr + i * sizeof(T));
#endif
  ptr += block_size;
  if (size != block_size) return nullptr;
  return ptr;
}